

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_const_value.h
# Opt level: O1

int64_t __thiscall t_const_value::get_integer(t_const_value *this)

{
  pointer pcVar1;
  int iVar2;
  long lVar3;
  t_enum_value *ptVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  long *plVar6;
  undefined4 extraout_var;
  size_type *psVar7;
  int64_t iVar8;
  string identifier;
  string local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  if (this->valType_ == CV_IDENTIFIER) {
    if (this->enum_ == (t_enum *)0x0) {
      pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __cxa_allocate_exception(0x20);
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      pcVar1 = (this->identifierVal_)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_88,pcVar1,pcVar1 + (this->identifierVal_)._M_string_length);
      std::operator+(&local_a8,"have identifier \"",&local_88);
      std::operator+(pbVar5,&local_a8,"\", but unset enum on line!");
      __cxa_throw(pbVar5,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
    }
    pcVar1 = (this->identifierVal_)._M_dataplus._M_p;
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_a8,pcVar1,pcVar1 + (this->identifierVal_)._M_string_length);
    lVar3 = std::__cxx11::string::rfind((char)&local_a8,0x2e);
    if (lVar3 != -1) {
      std::__cxx11::string::substr((ulong)&local_88,(ulong)&local_a8);
      std::__cxx11::string::operator=((string *)&local_a8,(string *)&local_88);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p);
      }
    }
    ptVar4 = t_enum::get_constant_by_name(this->enum_,&local_a8);
    if (ptVar4 == (t_enum_value *)0x0) {
      pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __cxa_allocate_exception(0x20);
      std::operator+(&local_48,"Unable to find enum value \"",&local_a8);
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_48);
      local_68._M_dataplus._M_p = (pointer)*plVar6;
      psVar7 = (size_type *)(plVar6 + 2);
      if ((size_type *)local_68._M_dataplus._M_p == psVar7) {
        local_68.field_2._M_allocated_capacity = *psVar7;
        local_68.field_2._8_4_ = (undefined4)plVar6[3];
        local_68.field_2._12_4_ = *(undefined4 *)((long)plVar6 + 0x1c);
        local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      }
      else {
        local_68.field_2._M_allocated_capacity = *psVar7;
      }
      local_68._M_string_length = plVar6[1];
      *plVar6 = (long)psVar7;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      iVar2 = (*(this->enum_->super_t_type).super_t_doc._vptr_t_doc[3])();
      std::operator+(&local_88,&local_68,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(extraout_var,iVar2));
      std::operator+(pbVar5,&local_88,"\"");
      __cxa_throw(pbVar5,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
    }
    iVar8 = (int64_t)ptVar4->value_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p);
    }
  }
  else {
    iVar8 = this->intVal_;
  }
  return iVar8;
}

Assistant:

int64_t get_integer() const {
    if (valType_ == CV_IDENTIFIER) {
      if (enum_ == nullptr) {
        throw "have identifier \"" + get_identifier() + "\", but unset enum on line!";
      }
      std::string identifier = get_identifier();
      std::string::size_type dot = identifier.rfind('.');
      if (dot != std::string::npos) {
        identifier = identifier.substr(dot + 1);
      }
      t_enum_value* val = enum_->get_constant_by_name(identifier);
      if (val == nullptr) {
        throw "Unable to find enum value \"" + identifier + "\" in enum \"" + enum_->get_name()
            + "\"";
      }
      return val->get_value();
    } else {
      return intVal_;
    }
  }